

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

int vec_eq(void *v,void *vv)

{
  int iVar1;
  int iVar2;
  AbstractVec *avv;
  AbstractVec *av;
  long lVar3;
  
  iVar1 = *v;
  iVar2 = 0;
  if ((iVar1 == *vv) && (iVar2 = 1, iVar1 != 0)) {
    lVar3 = 0;
    do {
      if (*(long *)(*(long *)((long)v + 8) + lVar3 * 8) !=
          *(long *)(*(long *)((long)vv + 8) + lVar3 * 8)) {
        return 0;
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 != (int)lVar3);
  }
  return iVar2;
}

Assistant:

int vec_eq(void *v, void *vv) {
  AbstractVec *av = (AbstractVec *)v;
  AbstractVec *avv = (AbstractVec *)vv;
  uint i;

  if (av->n != avv->n) return 0;
  for (i = 0; i < av->n; i++)
    if (av->v[i] != avv->v[i]) return 0;
  return 1;
}